

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

real_t tinyobj::parseReal(char **token,double default_value)

{
  byte *pbVar1;
  byte bVar2;
  char *__s;
  bool bVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_38;
  
  __s = *token;
  sVar6 = strspn(__s," \t");
  pbVar11 = (byte *)(__s + sVar6);
  *token = (char *)pbVar11;
  sVar6 = strcspn((char *)pbVar11," \t\r");
  pbVar1 = pbVar11 + sVar6;
  local_38 = default_value;
  if ((long)sVar6 < 1) goto LAB_0012141c;
  bVar2 = *pbVar11;
  if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
    pbVar11 = pbVar11 + 1;
    dVar15 = *(double *)(&DAT_0016fe40 + (ulong)(bVar2 == 0x2b) * 8);
  }
  else {
    if (9 < (int)(char)bVar2 - 0x30U) goto LAB_0012141c;
    dVar15 = 1.0;
  }
  dVar16 = 0.0;
  bVar13 = pbVar11 == pbVar1;
  pbVar12 = pbVar11;
  if (bVar13) {
    bVar3 = true;
  }
  else {
    uVar7 = (int)(char)*pbVar11 - 0x30;
    bVar3 = uVar7 >= 10;
    if (uVar7 < 10) {
      do {
        pbVar11 = pbVar11 + 1;
        dVar16 = (double)(int)uVar7 + dVar16 * 10.0;
        bVar13 = pbVar11 == pbVar1;
        pbVar12 = pbVar1;
        if (bVar13) break;
        uVar7 = (int)(char)*pbVar11 - 0x30;
        pbVar12 = pbVar11;
      } while (uVar7 < 10);
    }
    else {
      bVar13 = false;
    }
  }
  if (bVar3) goto LAB_0012141c;
  iVar9 = 0;
  if (!bVar13) {
    bVar2 = *pbVar12;
    bVar13 = true;
    pbVar11 = pbVar12;
    if ((bVar2 != 0x65) && (bVar2 != 0x45)) {
      iVar9 = 0;
      if (bVar2 != 0x2e) goto LAB_001213d6;
      bVar13 = pbVar12 + 1 != pbVar1;
      pbVar11 = pbVar12 + 1;
      if (bVar13) {
        uVar10 = 1;
        iVar9 = -1;
        do {
          bVar2 = pbVar12[uVar10];
          if (9 < (int)(char)bVar2 - 0x30U) {
            bVar13 = true;
            pbVar11 = pbVar12 + uVar10;
            break;
          }
          if (uVar10 < 8) {
            dVar14 = *(double *)
                      (tryParseDouble(char_const*,char_const*,double*)::pow_lut + uVar10 * 8);
          }
          else {
            dVar14 = pow(10.0,(double)iVar9);
          }
          dVar16 = dVar16 + (double)(int)((int)(char)bVar2 - 0x30U) * dVar14;
          iVar9 = iVar9 + -1;
          lVar8 = uVar10 + 1;
          uVar10 = uVar10 + 1;
          bVar13 = pbVar12 + lVar8 != pbVar1;
          pbVar11 = pbVar1;
        } while (bVar13);
      }
    }
    iVar9 = 0;
    if ((bVar13) && ((*pbVar11 | 0x20) == 0x65)) {
      pbVar12 = pbVar11 + 1;
      if ((pbVar12 == pbVar1) || ((bVar2 = *pbVar12, bVar2 != 0x2d && (bVar2 != 0x2b)))) {
        iVar5 = 1;
        if (9 < (int)(char)*pbVar12 - 0x30U) goto LAB_0012141c;
      }
      else {
        pbVar12 = pbVar11 + 2;
        iVar5 = (uint)(bVar2 == 0x2b) * 2 + -1;
      }
      if (pbVar12 == pbVar1) {
        bVar13 = true;
        iVar9 = 0;
      }
      else {
        lVar8 = 0;
        iVar9 = 0;
        do {
          if (9 < (int)(char)pbVar12[lVar8] - 0x30U) goto LAB_001213c2;
          iVar9 = ((int)(char)pbVar12[lVar8] - 0x30U) + iVar9 * 10;
          lVar4 = lVar8 + 1;
          lVar8 = lVar8 + 1;
        } while (pbVar12 + lVar4 != pbVar1);
        lVar8 = 1;
LAB_001213c2:
        bVar13 = (int)lVar8 == 0;
      }
      if (bVar13) goto LAB_0012141c;
      iVar9 = iVar9 * iVar5;
    }
  }
LAB_001213d6:
  if (iVar9 != 0) {
    dVar14 = pow(5.0,(double)iVar9);
    dVar16 = ldexp(dVar14 * dVar16,iVar9);
  }
  local_38 = dVar15 * dVar16;
LAB_0012141c:
  *token = (char *)pbVar1;
  return (float)local_38;
}

Assistant:

static inline real_t parseReal(const char **token, double default_value = 0.0) {
  (*token) += strspn((*token), " \t");
  const char *end = (*token) + strcspn((*token), " \t\r");
  double val = default_value;
  tryParseDouble((*token), end, &val);
  real_t f = static_cast<real_t>(val);
  (*token) = end;
  return f;
}